

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O2

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getRowViolation(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *maxviol,
                 number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *sumviol)

{
  bool bVar1;
  type_conflict5 tVar2;
  uint i;
  cpp_dec_float<100U,_int,_void> local_198;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  activity;
  cpp_dec_float<100U,_int,_void> local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rhs;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lhs;
  
  bVar1 = isPrimalFeasible(this);
  if (bVar1) {
    _syncRealSolution(this);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::VectorBase(&activity,
                 (this->_realLP->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum);
    (*(this->_realLP->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x46])(this->_realLP,&this->_solReal,&activity,1);
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)maxviol,0.0);
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)sumviol,0.0);
    i = (this->_realLP->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .set.thenum;
    while (0 < (int)i) {
      i = i - 1;
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::lhsUnscaled(&lhs,this->_realLP,i);
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::rhsUnscaled(&rhs,this->_realLP,i);
      local_198.fpclass = cpp_dec_float_finite;
      local_198.prec_elem = 0x10;
      local_198.data._M_elems[0] = 0;
      local_198.data._M_elems[1] = 0;
      local_198.data._M_elems[2] = 0;
      local_198.data._M_elems[3] = 0;
      local_198.data._M_elems[4] = 0;
      local_198.data._M_elems[5] = 0;
      local_198.data._M_elems[6] = 0;
      local_198.data._M_elems[7] = 0;
      local_198.data._M_elems[8] = 0;
      local_198.data._M_elems[9] = 0;
      local_198.data._M_elems[10] = 0;
      local_198.data._M_elems[0xb] = 0;
      local_198.data._M_elems[0xc] = 0;
      local_198.data._M_elems[0xd] = 0;
      local_198.data._M_elems._56_5_ = 0;
      local_198.data._M_elems[0xf]._1_3_ = 0;
      local_198.exp = 0;
      local_198.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&local_198,&lhs.m_backend,
                 &activity.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[i].m_backend);
      local_128.data._M_elems[0] = 0;
      local_128.data._M_elems[1] = 0;
      tVar2 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_198,(double *)&local_128);
      if (tVar2) {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                  (&sumviol->m_backend,&local_198);
        tVar2 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_198,maxviol);
        if (tVar2) {
          *(undefined8 *)((maxviol->m_backend).data._M_elems + 0xc) = local_198.data._M_elems._48_8_
          ;
          *(ulong *)((maxviol->m_backend).data._M_elems + 0xe) =
               CONCAT35(local_198.data._M_elems[0xf]._1_3_,local_198.data._M_elems._56_5_);
          *(undefined8 *)((maxviol->m_backend).data._M_elems + 8) = local_198.data._M_elems._32_8_;
          *(undefined8 *)((maxviol->m_backend).data._M_elems + 10) = local_198.data._M_elems._40_8_;
          *(undefined8 *)((maxviol->m_backend).data._M_elems + 4) = local_198.data._M_elems._16_8_;
          *(undefined8 *)((maxviol->m_backend).data._M_elems + 6) = local_198.data._M_elems._24_8_;
          *(undefined8 *)(maxviol->m_backend).data._M_elems = local_198.data._M_elems._0_8_;
          *(undefined8 *)((maxviol->m_backend).data._M_elems + 2) = local_198.data._M_elems._8_8_;
          (maxviol->m_backend).exp = local_198.exp;
          (maxviol->m_backend).neg = local_198.neg;
          (maxviol->m_backend).fpclass = local_198.fpclass;
          (maxviol->m_backend).prec_elem = local_198.prec_elem;
        }
      }
      local_128.fpclass = cpp_dec_float_finite;
      local_128.prec_elem = 0x10;
      local_128.data._M_elems[0] = 0;
      local_128.data._M_elems[1] = 0;
      local_128.data._M_elems[2] = 0;
      local_128.data._M_elems[3] = 0;
      local_128.data._M_elems[4] = 0;
      local_128.data._M_elems[5] = 0;
      local_128.data._M_elems[6] = 0;
      local_128.data._M_elems[7] = 0;
      local_128.data._M_elems[8] = 0;
      local_128.data._M_elems[9] = 0;
      local_128.data._M_elems[10] = 0;
      local_128.data._M_elems[0xb] = 0;
      local_128.data._M_elems[0xc] = 0;
      local_128.data._M_elems[0xd] = 0;
      local_128.data._M_elems._56_5_ = 0;
      local_128.data._M_elems[0xf]._1_3_ = 0;
      local_128.exp = 0;
      local_128.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&local_128,
                 &activity.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[i].m_backend,&rhs.m_backend);
      local_198.data._M_elems[0xc] = local_128.data._M_elems[0xc];
      local_198.data._M_elems[0xd] = local_128.data._M_elems[0xd];
      local_198.data._M_elems._56_5_ = local_128.data._M_elems._56_5_;
      local_198.data._M_elems[0xf]._1_3_ = local_128.data._M_elems[0xf]._1_3_;
      local_198.data._M_elems[8] = local_128.data._M_elems[8];
      local_198.data._M_elems[9] = local_128.data._M_elems[9];
      local_198.data._M_elems[10] = local_128.data._M_elems[10];
      local_198.data._M_elems[0xb] = local_128.data._M_elems[0xb];
      local_198.data._M_elems[4] = local_128.data._M_elems[4];
      local_198.data._M_elems[5] = local_128.data._M_elems[5];
      local_198.data._M_elems[6] = local_128.data._M_elems[6];
      local_198.data._M_elems[7] = local_128.data._M_elems[7];
      local_198.data._M_elems[0] = local_128.data._M_elems[0];
      local_198.data._M_elems[1] = local_128.data._M_elems[1];
      local_198.data._M_elems[2] = local_128.data._M_elems[2];
      local_198.data._M_elems[3] = local_128.data._M_elems[3];
      local_198.exp = local_128.exp;
      local_198.neg = local_128.neg;
      local_198.fpclass = local_128.fpclass;
      local_198.prec_elem = local_128.prec_elem;
      local_128.data._M_elems[0] = 0;
      local_128.data._M_elems[1] = 0;
      tVar2 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_198,(double *)&local_128);
      if (tVar2) {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                  (&sumviol->m_backend,&local_198);
        tVar2 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_198,maxviol);
        if (tVar2) {
          *(undefined8 *)((maxviol->m_backend).data._M_elems + 0xc) = local_198.data._M_elems._48_8_
          ;
          *(ulong *)((maxviol->m_backend).data._M_elems + 0xe) =
               CONCAT35(local_198.data._M_elems[0xf]._1_3_,local_198.data._M_elems._56_5_);
          *(undefined8 *)((maxviol->m_backend).data._M_elems + 8) = local_198.data._M_elems._32_8_;
          *(undefined8 *)((maxviol->m_backend).data._M_elems + 10) = local_198.data._M_elems._40_8_;
          *(undefined8 *)((maxviol->m_backend).data._M_elems + 4) = local_198.data._M_elems._16_8_;
          *(undefined8 *)((maxviol->m_backend).data._M_elems + 6) = local_198.data._M_elems._24_8_;
          *(undefined8 *)(maxviol->m_backend).data._M_elems = local_198.data._M_elems._0_8_;
          *(undefined8 *)((maxviol->m_backend).data._M_elems + 2) = local_198.data._M_elems._8_8_;
          (maxviol->m_backend).exp = local_198.exp;
          (maxviol->m_backend).neg = local_198.neg;
          (maxviol->m_backend).fpclass = local_198.fpclass;
          (maxviol->m_backend).prec_elem = local_198.prec_elem;
        }
      }
    }
    std::
    _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ::~_Vector_base((_Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     *)&activity);
  }
  return bVar1;
}

Assistant:

bool SoPlexBase<R>::getRowViolation(R& maxviol, R& sumviol)
{
   if(!isPrimalFeasible())
      return false;

   _syncRealSolution();
   VectorBase<R>& primal = _solReal._primal;
   assert(primal.dim() == numCols());

   VectorBase<R> activity(numRows());
   _realLP->computePrimalActivity(primal, activity, true);
   maxviol = 0.0;
   sumviol = 0.0;

   for(int i = numRows() - 1; i >= 0; i--)
   {
      R lhs = _realLP->lhsUnscaled(i);
      R rhs = _realLP->rhsUnscaled(i);

      R viol = lhs - activity[i];

      if(viol > 0.0)
      {
         sumviol += viol;

         if(viol > maxviol)
            maxviol = viol;
      }

      viol = activity[i] - rhs;

      if(viol > 0.0)
      {
         sumviol += viol;

         if(viol > maxviol)
            maxviol = viol;
      }
   }

   return true;
}